

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

char * ma_log_level_to_string(ma_uint32 logLevel)

{
  ma_uint32 logLevel_local;
  char *local_8;
  
  switch(logLevel) {
  case 1:
    local_8 = "ERROR";
    break;
  case 2:
    local_8 = "WARNING";
    break;
  case 3:
    local_8 = "INFO";
    break;
  case 4:
    local_8 = "DEBUG";
    break;
  default:
    local_8 = "ERROR";
  }
  return local_8;
}

Assistant:

MA_API const char* ma_log_level_to_string(ma_uint32 logLevel)
{
    switch (logLevel)
    {
        case MA_LOG_LEVEL_DEBUG:   return "DEBUG";
        case MA_LOG_LEVEL_INFO:    return "INFO";
        case MA_LOG_LEVEL_WARNING: return "WARNING";
        case MA_LOG_LEVEL_ERROR:   return "ERROR";
        default:                   return "ERROR";
    }
}